

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

_Bool init_work_queue(work_queue *queue)

{
  int iVar1;
  work_queue *queue_local;
  
  iVar1 = cnd_init(&queue->avail_cond);
  if (iVar1 == 0) {
    iVar1 = cnd_init(&queue->done_cond);
    if (iVar1 == 0) {
      iVar1 = mtx_init(&queue->mutex,0);
      if (iVar1 == 0) {
        queue->first_item = (work_item *)0x0;
        queue->last_item = (work_item *)0x0;
        queue->done_items = (work_item *)0x0;
        queue->worked_on = 0;
        queue->done_count = 0;
        queue->done_target = 0;
        return true;
      }
      cnd_destroy(&queue->done_cond);
    }
    cnd_destroy(&queue->avail_cond);
  }
  return false;
}

Assistant:

static inline bool init_work_queue(struct work_queue* queue) {
    if (cnd_init(&queue->avail_cond) != thrd_success)
        return false;        
    if (cnd_init(&queue->done_cond) != thrd_success)
        goto cleanup_cond;
    if (mtx_init(&queue->mutex, mtx_plain) != thrd_success)
        goto cleanup_mutex;
    queue->first_item = NULL;
    queue->last_item = NULL;
    queue->done_items = NULL;
    queue->worked_on = 0;
    queue->done_count = 0;
    queue->done_target = 0;
    return true;
cleanup_mutex:
    cnd_destroy(&queue->done_cond);
cleanup_cond:
    cnd_destroy(&queue->avail_cond);
    return false;
}